

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O1

bool Imf_3_2::anon_unknown_0::readTile<Imf_3_2::TiledInputFile>
               (TiledInputFile *in,bool reduceMemory,bool reduceTime)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  Header *pHVar8;
  long lVar9;
  _Rb_tree_node_base *p_Var10;
  _Rb_tree_node_base *p_Var11;
  bool bVar12;
  bool bVar13;
  int x;
  int iVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  size_type __n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> uintChannels;
  vector<float,_std::allocator<float>_> floatChannels;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> halfChannels;
  FrameBuffer i;
  allocator_type local_68 [56];
  
  Imf_3_2::TiledInputFile::header();
  piVar7 = (int *)Imf_3_2::Header::dataWindow();
  iVar3 = piVar7[2];
  iVar17 = *piVar7;
  iVar1 = Imf_3_2::TiledInputFile::numXLevels();
  iVar2 = Imf_3_2::TiledInputFile::numYLevels();
  Imf_3_2::TiledInputFile::header();
  piVar7 = (int *)Imf_3_2::Header::tileDescription();
  pHVar8 = (Header *)Imf_3_2::TiledInputFile::header();
  lVar9 = Imf_3_2::calculateBytesPerPixel(pHVar8);
  __n = ((long)iVar3 - (long)iVar17) + 1;
  if (reduceMemory) {
    bVar13 = false;
    bVar12 = false;
    if (8000000 < lVar9 * __n) goto LAB_0011493b;
    bVar13 = false;
    bVar12 = false;
    if (1000000 < lVar9 * (ulong)(uint)(piVar7[1] * *piVar7)) goto LAB_0011493b;
  }
  i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &i._map._M_t._M_impl.super__Rb_tree_header._M_header;
  i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  i._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::vector(&halfChannels,__n,local_68)
  ;
  std::vector<float,_std::allocator<float>_>::vector(&floatChannels,__n,(allocator_type *)local_68);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&uintChannels,__n,(allocator_type *)local_68);
  Imf_3_2::TiledInputFile::header();
  Imf_3_2::Header::channels();
  p_Var10 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
  uVar15 = 0;
  for (; p_Var11 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end(), p_Var10 != p_Var11;
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
    iVar3 = (int)uVar15 + (int)(uVar15 / 3) * -3;
    if (iVar3 == 2) {
LAB_001146e8:
      Imf_3_2::Slice::Slice
                ((Slice *)local_68,UINT,
                 (char *)(uintChannels.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start +
                         -(iVar17 / *(int *)&p_Var10[9].field_0x4)),4,0,
                 *(int *)&p_Var10[9].field_0x4,*(int *)&p_Var10[9]._M_parent,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var10 + 1));
    }
    else {
      if (iVar3 == 1) {
        Imf_3_2::Slice::Slice
                  ((Slice *)local_68,FLOAT,
                   (char *)(floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start +
                           -(iVar17 / *(int *)&p_Var10[9].field_0x4)),4,0,
                   *(int *)&p_Var10[9].field_0x4,*(int *)&p_Var10[9]._M_parent,0.0,false,false);
        Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var10 + 1));
        goto LAB_001146e8;
      }
      Imf_3_2::Slice::Slice
                ((Slice *)local_68,HALF,
                 (char *)(halfChannels.
                          super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                          _M_impl.super__Vector_impl_data._M_start +
                         -(iVar17 / *(int *)&p_Var10[9].field_0x4)),2,0,
                 *(int *)&p_Var10[9].field_0x4,*(int *)&p_Var10[9]._M_parent,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var10 + 1));
    }
    uVar15 = (ulong)((int)uVar15 + 1);
  }
  Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)in);
  iVar3 = 0;
  bVar13 = iVar2 < 1;
  if (0 < iVar2) {
    do {
      bVar12 = 0 < iVar1;
      if (0 < iVar1) {
        iVar17 = 0;
        do {
          iVar16 = 0;
          do {
            iVar4 = iVar16;
            iVar16 = (int)in;
            iVar5 = Imf_3_2::TiledInputFile::numYTiles(iVar16);
            if (iVar5 <= iVar4) break;
            for (iVar14 = 0; iVar6 = Imf_3_2::TiledInputFile::numXTiles(iVar16), iVar14 < iVar6;
                iVar14 = iVar14 + 1) {
              Imf_3_2::TiledInputFile::readTile(iVar16,iVar14,iVar4,iVar17);
            }
            iVar16 = iVar4 + 1;
          } while (iVar6 <= iVar14);
          if (iVar4 < iVar5) break;
          iVar17 = iVar17 + 1;
          bVar12 = iVar17 < iVar1;
        } while (iVar17 != iVar1);
      }
      if (bVar12) break;
      iVar3 = iVar3 + 1;
      bVar13 = iVar2 <= iVar3;
    } while (iVar3 != iVar2);
  }
  if (uintChannels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(uintChannels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)uintChannels.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)uintChannels.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (halfChannels.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(halfChannels.
                    super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)halfChannels.
                          super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)halfChannels.
                          super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
               *)&i);
  bVar12 = true;
LAB_0011493b:
  if (bVar13) {
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

bool
readTile (T& in, bool reduceMemory, bool reduceTime)
{
    bool threw = false;
    try
    {
        const Box2i& dw = in.header ().dataWindow ();

        uint64_t w = static_cast<uint64_t> (dw.max.x) -
                     static_cast<uint64_t> (dw.min.x) + 1;
        int dwx        = dw.min.x;
        int numXLevels = in.numXLevels ();
        int numYLevels = in.numYLevels ();

        const TileDescription& td    = in.header ().tileDescription ();
        uint64_t               bytes = calculateBytesPerPixel (in.header ());

        if (reduceMemory && (w * bytes > gMaxBytesPerScanline ||
                             (td.xSize * td.ySize * bytes) > gMaxTileBytes))
        {
            return false;
        }

        FrameBuffer i;
        // read all channels present (later channels will overwrite earlier ones)
        vector<half>         halfChannels (w);
        vector<float>        floatChannels (w);
        vector<unsigned int> uintChannels (w);

        int                channelIndex = 0;
        const ChannelList& channelList  = in.header ().channels ();
        for (ChannelList::ConstIterator c = channelList.begin ();
             c != channelList.end ();
             ++c)
        {
            switch (channelIndex % 3)
            {
                case 0:
                    i.insert (
                        c.name (),
                        Slice (
                            HALF,
                            (char*) &halfChannels
                                [-dwx / c.channel ().xSampling],
                            sizeof (half),
                            0,
                            c.channel ().xSampling,
                            c.channel ().ySampling));
                    break;
                case 1:
                    i.insert (
                        c.name (),
                        Slice (
                            FLOAT,
                            (char*) &floatChannels
                                [-dwx / c.channel ().xSampling],
                            sizeof (float),
                            0,
                            c.channel ().xSampling,
                            c.channel ().ySampling));
                case 2:
                    i.insert (
                        c.name (),
                        Slice (
                            UINT,
                            (char*) &uintChannels
                                [-dwx / c.channel ().xSampling],
                            sizeof (unsigned int),
                            0,
                            c.channel ().xSampling,
                            c.channel ().ySampling));
                    break;
            }
            channelIndex++;
        }

        in.setFrameBuffer (i);

        size_t step = 1;

        size_t tileIndex = 0;
        bool   isRipMap  = td.mode == RIPMAP_LEVELS;

        //
        // read all tiles from all levels.
        //
        for (int ylevel = 0; ylevel < numYLevels; ++ylevel)
        {
            for (int xlevel = 0; xlevel < numXLevels; ++xlevel)
            {
                for (int y = 0; y < in.numYTiles (ylevel); ++y)
                {
                    for (int x = 0; x < in.numXTiles (xlevel); ++x)
                    {
                        if (tileIndex % step == 0)
                        {
                            try
                            {
                                in.readTile (x, y, xlevel, ylevel);
                            }
                            catch (...)
                            {
                                //
                                // for one level and mipmapped images,
                                // xlevel must match ylevel,
                                // otherwise an exception is thrown
                                // ignore that exception
                                //
                                if (isRipMap || xlevel == ylevel)
                                {
                                    threw = true;

                                    //
                                    // in reduceTime mode, fail immediately - the file is corrupt
                                    //
                                    if (reduceTime) { return threw; }
                                }
                            }
                        }
                        tileIndex++;
                    }
                }
            }
        }
    }
    catch (...)
    {
        threw = true;
    }

    return threw;
}